

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O3

void stbtt_PackFontRangesPackRects(stbtt_pack_context *spc,stbrp_rect *rects,int num_rects)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  if (num_rects < 1) {
    uVar5 = 0;
LAB_0011438a:
    if ((int)uVar5 < num_rects) {
      lVar6 = (ulong)(uint)num_rects - (uVar5 & 0xffffffff);
      piVar7 = &rects[uVar5 & 0xffffffff].was_packed;
      do {
        *piVar7 = 0;
        piVar7 = piVar7 + 6;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  else {
    piVar4 = (int *)spc->pack_info;
    iVar1 = *piVar4;
    iVar2 = piVar4[1];
    iVar8 = piVar4[2];
    iVar9 = piVar4[3];
    piVar7 = &rects->was_packed;
    uVar5 = 0;
    do {
      iVar3 = piVar7[-2];
      if (iVar1 < iVar3 + iVar8) {
        piVar4[2] = 0;
        iVar9 = piVar4[4];
        piVar4[3] = iVar9;
        iVar8 = 0;
      }
      iVar10 = piVar7[-1] + iVar9;
      if (iVar2 < iVar10) goto LAB_0011438a;
      ((stbrp_rect *)(piVar7 + -5))->x = iVar8;
      piVar7[-4] = iVar9;
      *piVar7 = 1;
      iVar8 = iVar3 + iVar8;
      piVar4[2] = iVar8;
      if (piVar4[4] < iVar10) {
        piVar4[4] = iVar10;
      }
      uVar5 = uVar5 + 1;
      piVar7 = piVar7 + 6;
    } while ((uint)num_rects != uVar5);
  }
  return;
}

Assistant:

STBTT_DEF void stbtt_PackFontRangesPackRects(stbtt_pack_context *spc, stbrp_rect *rects, int num_rects)
{
   stbrp_pack_rects((stbrp_context *) spc->pack_info, rects, num_rects);
}